

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  string local_a0 [32];
  DataLisp local_80 [8];
  DataLisp lisp;
  SourceLogger logger;
  string local_58 [32];
  string local_38 [8];
  string content;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    std::__cxx11::string::string(local_38);
    get_file_contents_abi_cxx11_((char *)local_58);
    std::__cxx11::string::operator=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
    DL::SourceLogger::SourceLogger((SourceLogger *)&lisp);
    DL::DataLisp::DataLisp(local_80,(SourceLogger *)&lisp,true);
    DL::DataLisp::parse((string *)local_80);
    DL::DataLisp::dump_abi_cxx11_();
    poVar1 = std::operator<<((ostream *)&std::cout,local_a0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_a0);
    argv_local._4_4_ = 0;
    DL::DataLisp::~DataLisp(local_80);
    DL::SourceLogger::~SourceLogger((SourceLogger *)&lisp);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Use \'dl_dump [INPUT]\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
	if (argc != 2)
	{
		std::cout << "Use 'dl_dump [INPUT]'" << std::endl;
		return -1;
	}

	std::string content;
	try
	{
		content = get_file_contents(argv[1]);
	}
	catch (...)
	{
		std::cout << "Couldn't read file '" << argv[1] << "'" << std::endl;
		return -2;
	}

	DL::SourceLogger logger;
	DL::DataLisp lisp(&logger);

	lisp.parse(content);
	std::cout << lisp.dump() << std::endl;

	return 0;
}